

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_argv.cc
# Opt level: O0

void __thiscall anon_unknown.dwarf_28e3b0::ArgParser::argSetPageLabels(ArgParser *this)

{
  allocator<char> local_31;
  string local_30;
  ArgParser *local_10;
  ArgParser *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"set page labels",&local_31);
  QPDFArgParser::selectOptionTable(&this->ap,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->accumulated_args);
  return;
}

Assistant:

void
ArgParser::argSetPageLabels()
{
    this->ap.selectOptionTable(O_SET_PAGE_LABELS);
    accumulated_args.clear();
}